

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O3

void start_input_gif(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  int *piVar1;
  jpeg_error_mgr *pjVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  JSAMPARRAY ppJVar7;
  void *pvVar8;
  _func_void_j_compress_ptr_cjpeg_source_ptr *p_Var9;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var10;
  jvirt_sarray_ptr pjVar11;
  code *pcVar12;
  ulong uVar13;
  byte bVar14;
  cd_progress_ptr progress;
  uint cmaplen;
  j_compress_ptr pjVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  U_CHAR hdrbuf [10];
  U_CHAR buf [256];
  undefined2 local_142;
  undefined2 local_140;
  undefined2 local_13e;
  ushort local_13c;
  byte local_13a;
  U_CHAR local_138 [264];
  
  sVar6 = fread(&local_142,1,6,(FILE *)sinfo->input_file);
  if (sVar6 != 6) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3fb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((((char)local_142 != 'G') || (local_142._1_1_ != 'I')) || ((char)local_140 != 'F')) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3fb;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_13e._1_1_ != 0x61 || ((byte)local_13e != 0x37 || local_140._1_1_ != 0x38)) &&
     (((local_140._1_1_ != 0x38 || ((byte)local_13e != 0x39)) || (local_13e._1_1_ != 0x61)))) {
    pjVar2 = cinfo->err;
    *(uint *)&pjVar2->msg_parm = (uint)local_140._1_1_;
    *(uint *)((long)&pjVar2->msg_parm + 4) = (uint)(byte)local_13e;
    *(uint *)((long)&pjVar2->msg_parm + 8) = (uint)local_13e._1_1_;
    pjVar2->msg_code = 0x3fd;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
  }
  sVar6 = fread(&local_142,1,7,(FILE *)sinfo->input_file);
  if (sVar6 != 7) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_142 == 0) || (local_140 == 0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3f9;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if (((char)local_13c != '\0') && ((char)local_13c != '1')) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3ff;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
  }
  ppJVar7 = (*cinfo->mem->alloc_sarray)((j_common_ptr)cinfo,1,0x100,3);
  sinfo[1].get_pixel_rows = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)ppJVar7;
  cmaplen = 0;
  if ((char)(byte)local_13e < '\0') {
    cmaplen = 2 << ((byte)local_13e & 7);
    ReadColorMap((gif_source_ptr)sinfo,cmaplen,ppJVar7);
  }
LAB_001066c1:
  while (iVar5 = getc((FILE *)sinfo->input_file), iVar5 < 0x2c) {
    if (iVar5 == -1) {
      iVar17 = 0x2b;
      pjVar15 = (j_compress_ptr)sinfo[1].start_input;
LAB_00106750:
      pjVar2 = pjVar15->err;
      pjVar2->msg_code = iVar17;
      (*pjVar2->error_exit)((j_common_ptr)pjVar15);
      goto LAB_00106758;
    }
    if (iVar5 != 0x21) goto LAB_00106758;
    iVar5 = getc((FILE *)sinfo->input_file);
    if (iVar5 == -1) {
      puVar3 = *(undefined8 **)sinfo[1].start_input;
      *(undefined4 *)(puVar3 + 5) = 0x2b;
      (*(code *)*puVar3)();
    }
    lVar4 = *(long *)sinfo[1].start_input;
    *(undefined4 *)(lVar4 + 0x28) = 0x3fe;
    *(int *)(lVar4 + 0x2c) = iVar5;
    (**(code **)(*(long *)sinfo[1].start_input + 8))(sinfo[1].start_input,1);
    do {
      iVar5 = GetDataBlock((gif_source_ptr)sinfo,local_138);
    } while (0 < iVar5);
  }
  iVar17 = 0x3fa;
  pjVar15 = cinfo;
  if (iVar5 == 0x3b) goto LAB_00106750;
  if (iVar5 != 0x2c) {
LAB_00106758:
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x401;
    (pjVar2->msg_parm).i[0] = iVar5;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    goto LAB_001066c1;
  }
  sVar6 = fread(&local_142,1,9,(FILE *)sinfo->input_file);
  if (sVar6 != 9) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x2b;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  if ((local_13e == 0) || (local_13c == 0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x3f9;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  *(uint *)&sinfo[8].input_file = local_13a >> 6 & 1;
  if ((char)local_13a < '\0') {
    cmaplen = 2 << (local_13a & 7);
    ReadColorMap((gif_source_ptr)sinfo,cmaplen,(JSAMPARRAY)sinfo[1].get_pixel_rows);
  }
  iVar5 = getc((FILE *)sinfo->input_file);
  if (iVar5 == -1) {
    puVar3 = *(undefined8 **)sinfo[1].start_input;
    *(undefined4 *)(puVar3 + 5) = 0x2b;
    (*(code *)*puVar3)();
    *(undefined4 *)&sinfo[7].get_pixel_rows = 0xffffffff;
  }
  else {
    *(int *)&sinfo[7].get_pixel_rows = iVar5;
    if (0xfffffff8 < iVar5 - 9U) goto LAB_00106851;
  }
  pjVar2 = cinfo->err;
  pjVar2->msg_code = 0x3f7;
  (pjVar2->msg_parm).i[0] = iVar5;
  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00106851:
  pvVar8 = (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x2000);
  *(void **)&sinfo[7].buffer_height = pvVar8;
  p_Var9 = (_func_void_j_compress_ptr_cjpeg_source_ptr *)
           (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x1000);
  sinfo[8].start_input = p_Var9;
  p_Var10 = (_func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *)
            (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x1000);
  sinfo[8].get_pixel_rows = p_Var10;
  *(undefined4 *)((long)&sinfo[6].buffer + 4) = 2;
  *(undefined2 *)&sinfo[1].finish_input = 0;
  *(undefined8 *)&sinfo[6].buffer_height = 0;
  sinfo[7].start_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)0x1;
  iVar5 = *(int *)&sinfo[7].get_pixel_rows;
  bVar14 = (byte)iVar5;
  iVar17 = 1 << (bVar14 & 0x1f);
  *(int *)((long)&sinfo[7].get_pixel_rows + 4) = iVar17;
  *(int *)&sinfo[7].finish_input = iVar17 + 1;
  *(int *)((long)&sinfo[7].finish_input + 4) = iVar5 + 1;
  *(int *)&sinfo[7].input_file = 2 << (bVar14 & 0x1f);
  *(int *)((long)&sinfo[7].input_file + 4) = iVar17 + 2;
  sinfo[8].finish_input = (_func_void_j_compress_ptr_cjpeg_source_ptr *)p_Var10;
  uVar16 = (uint)local_13e;
  uVar18 = (uint)local_13c;
  if (*(int *)&sinfo[8].input_file == 0) {
    pcVar12 = get_pixel_rows;
  }
  else {
    pjVar11 = (*cinfo->mem->request_virt_sarray)((j_common_ptr)cinfo,1,0,uVar16,uVar18,1);
    sinfo[8].buffer = (JSAMPARRAY)pjVar11;
    pcVar12 = load_interlaced_image;
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      piVar1 = (int *)((long)&cinfo->progress[1].progress_monitor + 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  sinfo->get_pixel_rows = pcVar12;
  ppJVar7 = (*cinfo->mem->alloc_sarray)
                      ((j_common_ptr)cinfo,1,(uint)local_13e + (uint)local_13e * 2,1);
  sinfo->buffer = ppJVar7;
  sinfo->buffer_height = 1;
  if ((int)cmaplen < *(int *)((long)&sinfo[7].get_pixel_rows + 4)) {
    uVar13 = (ulong)cmaplen;
    do {
      *(undefined1 *)(*(long *)(sinfo[1].get_pixel_rows + 0x10) + uVar13) = 0x80;
      *(undefined1 *)(*(long *)(sinfo[1].get_pixel_rows + 8) + uVar13) = 0x80;
      *(undefined1 *)(*(long *)sinfo[1].get_pixel_rows + uVar13) = 0x80;
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)*(int *)((long)&sinfo[7].get_pixel_rows + 4));
  }
  cinfo->input_components = 3;
  cinfo->in_color_space = JCS_RGB;
  cinfo->data_precision = 8;
  cinfo->image_width = uVar16;
  cinfo->image_height = uVar18;
  pjVar2 = cinfo->err;
  *(uint *)&pjVar2->msg_parm = uVar16;
  *(uint *)((long)&pjVar2->msg_parm + 4) = uVar18;
  (pjVar2->msg_parm).i[2] = cmaplen;
  pjVar2->msg_code = 0x3fc;
  (*pjVar2->emit_message)((j_common_ptr)cinfo,1);
  return;
}

Assistant:

METHODDEF(void)
start_input_gif(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  U_CHAR hdrbuf[10];            /* workspace for reading control blocks */
  unsigned int width, height;   /* image dimensions */
  int colormaplen, aspectRatio;
  int c;

  /* Read and verify GIF Header */
  if (!ReadOK(source->pub.input_file, hdrbuf, 6))
    ERREXIT(cinfo, JERR_GIF_NOT);
  if (hdrbuf[0] != 'G' || hdrbuf[1] != 'I' || hdrbuf[2] != 'F')
    ERREXIT(cinfo, JERR_GIF_NOT);
  /* Check for expected version numbers.
   * If unknown version, give warning and try to process anyway;
   * this is per recommendation in GIF89a standard.
   */
  if ((hdrbuf[3] != '8' || hdrbuf[4] != '7' || hdrbuf[5] != 'a') &&
      (hdrbuf[3] != '8' || hdrbuf[4] != '9' || hdrbuf[5] != 'a'))
    TRACEMS3(cinfo, 1, JTRC_GIF_BADVERSION, hdrbuf[3], hdrbuf[4], hdrbuf[5]);

  /* Read and decipher Logical Screen Descriptor */
  if (!ReadOK(source->pub.input_file, hdrbuf, 7))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  width = LM_to_uint(hdrbuf, 0);
  height = LM_to_uint(hdrbuf, 2);
  if (width == 0 || height == 0)
    ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)width * height > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
  /* we ignore the color resolution, sort flag, and background color index */
  aspectRatio = UCH(hdrbuf[6]);
  if (aspectRatio != 0 && aspectRatio != 49)
    TRACEMS(cinfo, 1, JTRC_GIF_NONSQUARE);

  /* Allocate space to store the colormap */
  source->colormap = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)MAXCOLORMAPSIZE,
     (JDIMENSION)NUMCOLORS);
  colormaplen = 0;              /* indicate initialization */

  /* Read global colormap if header indicates it is present */
  if (BitSet(hdrbuf[4], COLORMAPFLAG)) {
    colormaplen = 2 << (hdrbuf[4] & 0x07);
    ReadColorMap(source, colormaplen, source->colormap);
  }

  /* Scan until we reach start of desired image.
   * We don't currently support skipping images, but could add it easily.
   */
  for (;;) {
    c = ReadByte(source);

    if (c == ';')               /* GIF terminator?? */
      ERREXIT(cinfo, JERR_GIF_IMAGENOTFOUND);

    if (c == '!') {             /* Extension */
      DoExtension(source);
      continue;
    }

    if (c != ',') {             /* Not an image separator? */
      WARNMS1(cinfo, JWRN_GIF_CHAR, c);
      continue;
    }

    /* Read and decipher Local Image Descriptor */
    if (!ReadOK(source->pub.input_file, hdrbuf, 9))
      ERREXIT(cinfo, JERR_INPUT_EOF);
    /* we ignore top/left position info, also sort flag */
    width = LM_to_uint(hdrbuf, 4);
    height = LM_to_uint(hdrbuf, 6);
    if (width == 0 || height == 0)
      ERREXIT(cinfo, JERR_GIF_EMPTY);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (sinfo->max_pixels &&
        (unsigned long long)width * height > sinfo->max_pixels)
      ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif
    source->is_interlaced = (BitSet(hdrbuf[8], INTERLACE) != 0);

    /* Read local colormap if header indicates it is present */
    /* Note: if we wanted to support skipping images, */
    /* we'd need to skip rather than read colormap for ignored images */
    if (BitSet(hdrbuf[8], COLORMAPFLAG)) {
      colormaplen = 2 << (hdrbuf[8] & 0x07);
      ReadColorMap(source, colormaplen, source->colormap);
    }

    source->input_code_size = ReadByte(source); /* get min-code-size byte */
    if (source->input_code_size < 2 || source->input_code_size > 8)
      ERREXIT1(cinfo, JERR_GIF_CODESIZE, source->input_code_size);

    /* Reached desired image, so break out of loop */
    /* If we wanted to skip this image, */
    /* we'd call SkipDataBlocks and then continue the loop */
    break;
  }

  /* Prepare to read selected image: first initialize LZW decompressor */
  source->symbol_head = (UINT16 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT16));
  source->symbol_tail = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  source->symbol_stack = (UINT8 *)
    (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                LZW_TABLE_SIZE * sizeof(UINT8));
  InitLZWCode(source);

  /*
   * If image is interlaced, we read it into a full-size sample array,
   * decompressing as we go; then get_interlaced_row selects rows from the
   * sample array in the proper order.
   */
  if (source->is_interlaced) {
    /* We request the virtual array now, but can't access it until virtual
     * arrays have been allocated.  Hence, the actual work of reading the
     * image is postponed until the first call to get_pixel_rows.
     */
    source->interlaced_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       (JDIMENSION)width, (JDIMENSION)height, (JDIMENSION)1);
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
    source->pub.get_pixel_rows = load_interlaced_image;
  } else {
    source->pub.get_pixel_rows = get_pixel_rows;
  }

  /* Create compressor input buffer. */
  source->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)width * NUMCOLORS,
     (JDIMENSION)1);
  source->pub.buffer_height = 1;

  /* Pad colormap for safety. */
  for (c = colormaplen; c < source->clear_code; c++) {
    source->colormap[CM_RED][c]   =
    source->colormap[CM_GREEN][c] =
    source->colormap[CM_BLUE][c]  = CENTERJSAMPLE;
  }

  /* Return info about the image. */
  cinfo->in_color_space = JCS_RGB;
  cinfo->input_components = NUMCOLORS;
  cinfo->data_precision = BITS_IN_JSAMPLE; /* we always rescale data to this */
  cinfo->image_width = width;
  cinfo->image_height = height;

  TRACEMS3(cinfo, 1, JTRC_GIF, width, height, colormaplen);
}